

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option_button.cpp
# Opt level: O1

void destroy_option_button(Am_Object *object)

{
  Am_Value *in_value;
  Am_Object_Demon *pAVar1;
  Am_Object sub_menu;
  Am_Object in_stack_ffffffffffffffd8;
  Am_Demon_Set local_20;
  Am_Object local_18;
  
  in_value = Am_Object::Get(object,0x1d2,0);
  Am_Object::Am_Object(&local_18,in_value);
  Am_Object::Destroy(&local_18);
  Am_Object_Advanced::Get_Demons((Am_Object_Advanced *)&local_20);
  pAVar1 = Am_Demon_Set::Get_Object_Demon(&local_20,Am_DESTROY_OBJ);
  Am_Demon_Set::~Am_Demon_Set(&local_20);
  if (pAVar1 != (Am_Object_Demon *)0x0) {
    Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffd8,object);
    (*pAVar1)(in_stack_ffffffffffffffd8);
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffd8);
  }
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

void
destroy_option_button(Am_Object object)
{
  Am_Object sub_menu = object.Get(Am_SUB_MENU);
  sub_menu.Destroy();

  //now run the regular button destroy demon, if any
  Am_Object_Demon *proto_demon = ((Am_Object_Advanced &)Am_Button)
                                     .Get_Demons()
                                     .Get_Object_Demon(Am_DESTROY_OBJ);
  if (proto_demon)
    proto_demon(object);
}